

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPileCollider.cpp
# Opt level: O2

Position __thiscall
solitaire::colliders::TableauPileCollider::getCardPosition(TableauPileCollider *this,uint index)

{
  uint uVar1;
  uint uVar2;
  Position PVar3;
  
  throwIfInvalidIndex(this,index);
  uVar2 = (*(this->tableauPile->super_Archiver)._vptr_Archiver[8])();
  uVar1 = index;
  if (uVar2 < index) {
    uVar1 = uVar2;
  }
  if (index < uVar2) {
    index = uVar2;
  }
  PVar3.y = uVar1 * 3 + uVar2 * -0x10 + index * 0x10 + (this->position).y;
  PVar3.x = (this->position).x;
  return PVar3;
}

Assistant:

Position TableauPileCollider::getCardPosition(const unsigned index) const {
    throwIfInvalidIndex(index);
    const auto topCoveredCardPosition = tableauPile.getTopCoveredCardPosition();
    return position + getRelativeCardPosition(index, topCoveredCardPosition);
}